

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O0

void Helpers::TTReportLastIOErrorAsNeeded(BOOL ok,char *msg)

{
  uint uVar1;
  PAL_FILE *pPVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  char *msg_local;
  BOOL ok_local;
  
  if (ok == 0) {
    pPVar2 = PAL_get_stderr(0);
    puVar3 = (uint *)PAL_errno(0);
    uVar1 = *puVar3;
    piVar4 = PAL_errno(0);
    pcVar5 = strerror(*piVar4);
    PAL_fprintf(pPVar2,"Error is: %i %s\n",(ulong)uVar1,pcVar5);
    pPVar2 = PAL_get_stderr(0);
    PAL_fprintf(pPVar2,"Message is: %s\n",msg);
    pPVar2 = PAL_get_stderr(0);
    PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Helpers.cpp"
                ,0x20c,"false","IO Error!!!");
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    DebugBreak();
    PAL_exit(1);
  }
  return;
}

Assistant:

void Helpers::TTReportLastIOErrorAsNeeded(BOOL ok, const char* msg)
{
    if(!ok)
    {
#ifdef _WIN32
        DWORD lastError = GetLastError();
        LPTSTR pTemp = NULL;
        FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS, NULL, lastError, 0, (LPTSTR)&pTemp, 0, NULL);
        fwprintf(stderr, _u("Error is: %s\n"), pTemp);
        LocalFree(pTemp);
#else
        fprintf(stderr, "Error is: %i %s\n", errno, strerror(errno));
#endif
        fprintf(stderr, "Message is: %s\n", msg);

        AssertMsg(false, "IO Error!!!");
        exit(1);
    }
}